

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handler.cc
# Opt level: O0

void __thiscall
prometheus::detail::MetricsHandler::RegisterCollectable
          (MetricsHandler *this,weak_ptr<prometheus::Collectable> *collectable)

{
  lock_guard<std::mutex> local_20;
  lock_guard<std::mutex> lock;
  weak_ptr<prometheus::Collectable> *collectable_local;
  MetricsHandler *this_local;
  
  lock._M_device = (mutex_type *)collectable;
  std::lock_guard<std::mutex>::lock_guard(&local_20,&this->collectables_mutex_);
  CleanupStalePointers(&this->collectables_);
  std::
  vector<std::weak_ptr<prometheus::Collectable>,_std::allocator<std::weak_ptr<prometheus::Collectable>_>_>
  ::push_back(&this->collectables_,(value_type *)lock._M_device);
  std::lock_guard<std::mutex>::~lock_guard(&local_20);
  return;
}

Assistant:

void MetricsHandler::RegisterCollectable(
    const std::weak_ptr<Collectable>& collectable) {
  std::lock_guard<std::mutex> lock{collectables_mutex_};
  CleanupStalePointers(collectables_);
  collectables_.push_back(collectable);
}